

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mapper_2.cpp
# Opt level: O0

uint8_t __thiscall n_e_s::core::Mapper2::cpu_read_byte(Mapper2 *this,uint16_t addr)

{
  const_reference pvVar1;
  InvalidAddress *this_00;
  uint32_t mapped_addr_1;
  uint32_t mapped_addr;
  uint16_t addr_local;
  Mapper2 *this_local;
  
  if ((addr < 0x8000) || (0xbfff < addr)) {
    if (addr < 0xc000) {
      this_00 = (InvalidAddress *)__cxa_allocate_exception(0x28);
      InvalidAddress::InvalidAddress(this_00,addr);
      __cxa_throw(this_00,&InvalidAddress::typeinfo,InvalidAddress::~InvalidAddress);
    }
    pvVar1 = std::vector<unsigned_char,_std::allocator<unsigned_char>_>::operator[]
                       (&this->prg_rom_,
                        (ulong)((uint)this->select_bank_hi_ * 0x4000 + (addr & 0x3fff)));
    this_local._7_1_ = *pvVar1;
  }
  else {
    pvVar1 = std::vector<unsigned_char,_std::allocator<unsigned_char>_>::operator[]
                       (&this->prg_rom_,
                        (ulong)((uint)this->select_bank_low_ * 0x4000 + (addr & 0x3fff)));
    this_local._7_1_ = *pvVar1;
  }
  return this_local._7_1_;
}

Assistant:

uint8_t Mapper2::cpu_read_byte(uint16_t addr) const {
    if (addr >= kSwitchablePrgRomStart && addr <= kSwitchablePrgRomEnd) {
        const uint32_t mapped_addr =
                select_bank_low_ * 0x4000u + (addr & 0x3FFFu);
        return prg_rom_[mapped_addr];
    }

    if (addr >= kLastBankPrgRomStart) {
        const uint32_t mapped_addr =
                select_bank_hi_ * 0x4000u + (addr & 0x3FFFu);
        return prg_rom_[mapped_addr];
    }

    throw InvalidAddress(addr);
}